

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<Function>::relocate
          (QArrayDataPointer<Function> *this,qsizetype offset,Function **data)

{
  bool bVar1;
  Function *in_RDX;
  long in_RSI;
  Function *in_RDI;
  Function **unaff_retaddr;
  Function *res;
  char16_t *n;
  Function *c;
  
  n = (in_RDI->className).d.ptr + in_RSI * 0x24;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<Function,long_long>(in_RDX,(longlong)n,in_RDI);
  if ((in_RDX != (Function *)0x0) &&
     (bVar1 = QtPrivate::q_points_into_range<QArrayDataPointer<Function>,Function_const*>
                        (unaff_retaddr,(QArrayDataPointer<Function> *)c), bVar1)) {
    (in_RDX->className).d.d = (Data *)(in_RSI * 0x48 + (long)(in_RDX->className).d.d);
  }
  (in_RDI->className).d.ptr = n;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }